

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.hpp
# Opt level: O0

uint16_t __thiscall InstructionSet::x86::Flags::get(Flags *this)

{
  bool bVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  Flags *this_local;
  
  bVar1 = flag<(InstructionSet::x86::Flag)0>(this);
  bVar2 = flag<(InstructionSet::x86::Flag)1>(this);
  uVar3 = 0;
  if (bVar2) {
    uVar3 = 0x10;
  }
  bVar2 = flag<(InstructionSet::x86::Flag)2>(this);
  uVar4 = 0;
  if (bVar2) {
    uVar4 = 0x80;
  }
  bVar2 = flag<(InstructionSet::x86::Flag)3>(this);
  uVar5 = 0;
  if (bVar2) {
    uVar5 = 0x800;
  }
  bVar2 = flag<(InstructionSet::x86::Flag)4>(this);
  uVar6 = 0;
  if (bVar2) {
    uVar6 = 0x100;
  }
  bVar2 = flag<(InstructionSet::x86::Flag)5>(this);
  uVar7 = 0;
  if (bVar2) {
    uVar7 = 0x200;
  }
  bVar2 = flag<(InstructionSet::x86::Flag)6>(this);
  uVar8 = 0;
  if (bVar2) {
    uVar8 = 0x400;
  }
  bVar2 = flag<(InstructionSet::x86::Flag)7>(this);
  uVar9 = 0;
  if (bVar2) {
    uVar9 = 0x40;
  }
  bVar2 = flag<(InstructionSet::x86::Flag)8>(this);
  uVar10 = 4;
  if (bVar2) {
    uVar10 = 0;
  }
  return bVar1 | 0xf002 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8 | uVar9 | uVar10;
}

Assistant:

uint16_t get() const {
			return
				0xf002 |

				(flag<Flag::Carry>() ? FlagValue::Carry : 0) |
				(flag<Flag::AuxiliaryCarry>() ? FlagValue::AuxiliaryCarry : 0) |
				(flag<Flag::Sign>() ? FlagValue::Sign : 0) |
				(flag<Flag::Overflow>() ? FlagValue::Overflow : 0) |
				(flag<Flag::Trap>() ? FlagValue::Trap : 0) |
				(flag<Flag::Interrupt>() ? FlagValue::Interrupt : 0) |
				(flag<Flag::Direction>() ? FlagValue::Direction : 0) |
				(flag<Flag::Zero>() ? FlagValue::Zero : 0) |

				(flag<Flag::ParityOdd>() ? 0 : FlagValue::Parity);
		}